

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Functional::DitheringTests::init(DitheringTests *this,EVP_PKEY_CTX *ctx)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  TestNode *this_00;
  bool bVar5;
  TestNode *node;
  long *plVar6;
  DitheringCase *this_01;
  long *plVar7;
  size_type *psVar8;
  PatternType patternType;
  char *pcVar9;
  char *__end;
  long lVar10;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  TestNode *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string caseName;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  if (init()::caseColors == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  pcVar9 = (char *)0x0;
  local_a0 = (TestNode *)this;
  bVar5 = true;
  do {
    bVar3 = bVar5;
    this_00 = local_a0;
    node = (TestNode *)operator_new(0x78);
    pp_Var1 = this_00[1]._vptr_TestNode;
    pcVar4 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
    if (((ulong)pcVar9 & 1) != 0) {
      pcVar4 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
    }
    local_38 = pcVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(TestContext *)*pp_Var1,pcVar4 + 0x27,"");
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
    node[1]._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild(this_00,node);
    patternType = PATTERNTYPE_GRADIENT;
    bVar5 = true;
    do {
      bVar2 = bVar5;
      lVar10 = 0;
      do {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"","");
        plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
        local_c0 = &local_b0;
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_b0 = *plVar7;
          lStack_a8 = plVar6[3];
        }
        else {
          local_b0 = *plVar7;
          local_c0 = (long *)*plVar6;
        }
        local_b8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_98 = &local_88;
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_88 = *plVar7;
          lStack_80 = plVar6[3];
        }
        else {
          local_88 = *plVar7;
          local_98 = (long *)*plVar6;
        }
        local_90 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          caseName.field_2._M_allocated_capacity = *psVar8;
          caseName.field_2._8_8_ = plVar6[3];
        }
        else {
          caseName.field_2._M_allocated_capacity = *psVar8;
          caseName._M_dataplus._M_p = (pointer)*plVar6;
        }
        caseName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        this_01 = (DitheringCase *)operator_new(0xb0);
        DitheringCase::DitheringCase
                  (this_01,(TestContext *)*local_a0[1]._vptr_TestNode,
                   (RenderContext *)local_a0[1]._vptr_TestNode[1],caseName._M_dataplus._M_p,"",
                   (bool)((byte)local_38 & 1),patternType,
                   (Vec4 *)((long)init::caseColors[0].color.m_data + lVar10));
        tcu::TestNode::addChild(node,(TestNode *)this_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)caseName._M_dataplus._M_p != &caseName.field_2) {
          operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
        }
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x78);
      patternType = PATTERNTYPE_UNICOLORED_QUAD;
      bVar5 = false;
    } while (bVar2);
    pcVar9 = "o 2";
  } while (bVar3);
  return 0;
}

Assistant:

void DitheringTests::init (void)
{
	static const struct
	{
		const char*		name;
		Vec4			color;
	} caseColors[] =
	{
		{ "white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
		{ "red",		Vec4(1.0f, 0.0f, 0.0f, 1.0f) },
		{ "green",		Vec4(0.0f, 1.0f, 0.0f, 1.0f) },
		{ "blue",		Vec4(0.0f, 0.0f, 1.0f, 1.0f) },
		{ "alpha",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) }
	};

	for (int ditheringEnabledI = 0; ditheringEnabledI <= 1; ditheringEnabledI++)
	{
		const bool				ditheringEnabled	= ditheringEnabledI != 0;
		TestCaseGroup* const	group				= new TestCaseGroup(m_context, ditheringEnabled ? "enabled" : "disabled", "");
		addChild(group);

		for (int patternTypeI = 0; patternTypeI < DitheringCase::PATTERNTYPE_LAST; patternTypeI++)
		{
			for (int caseColorNdx = 0; caseColorNdx < DE_LENGTH_OF_ARRAY(caseColors); caseColorNdx++)
			{
				const DitheringCase::PatternType	patternType		= (DitheringCase::PatternType)patternTypeI;
				const string						caseName		= string("") + DitheringCase::getPatternTypeName(patternType) + "_" + caseColors[caseColorNdx].name;

				group->addChild(new DitheringCase(m_context.getTestContext(), m_context.getRenderContext(), caseName.c_str(), "", ditheringEnabled, patternType, caseColors[caseColorNdx].color));
			}
		}
	}
}